

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawElementsBaseVertexTests.cpp
# Opt level: O3

IterateResult __thiscall
glcts::DrawElementsBaseVertexNegativeMappedBufferObjectsTest::iterate
          (DrawElementsBaseVertexNegativeMappedBufferObjectsTest *this)

{
  int iVar1;
  uint uVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *pTVar5;
  uint uVar6;
  stringstream error_sstream;
  string local_358;
  undefined1 local_338 [8];
  _func_int **local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328 [6];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8;
  long lVar4;
  
  iVar1 = (*((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.m_context)->m_renderCtx
            ->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  uVar6 = 0;
  do {
    uVar2 = (*((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.m_context)->
              m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar6 < 2) && (uVar6 == 0 || (uVar2 & 0x300) == 0)) {
      DrawElementsBaseVertexTestBase::setUpNegativeTestObjects
                (&this->super_DrawElementsBaseVertexTestBase,false,uVar6 != 0);
      (**(code **)(lVar4 + 0xd00))
                (0x8892,0,(this->super_DrawElementsBaseVertexTestBase).
                          m_bo_negative_data_vertex_size,1);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glMapBufferRange() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                      ,0xd0c);
      (**(code **)(lVar4 + 0x570))
                (4,3,0x1405,(this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset,0)
      ;
      iVar1 = (**(code **)(lVar4 + 0x800))();
      if (iVar1 != 0x502) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a8,"Invalid error code generated by ",0x20);
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  ((string *)local_338,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a8,(char *)local_338,(long)local_330);
        if (local_338 != (undefined1  [8])local_328) {
          operator_delete((void *)local_338,local_328[0]._M_allocated_capacity + 1);
        }
        local_338 = (undefined1  [8])
                    ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.super_TestCase.
                     super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  (&local_358,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_330,local_358._M_dataplus._M_p,local_358._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_330," returned error code [",0x16);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_330);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_330,"] instead of GL_INVALID_OPERATION.",0x22);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330);
        std::ios_base::~ios_base(local_2c0);
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        tcu::TestError::TestError
                  (pTVar5,(char *)local_338,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                   ,0xd22);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar4 + 0x590))
                (4,3,0x1405,(this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset,1,
                 0);
      iVar1 = (**(code **)(lVar4 + 0x800))();
      if (iVar1 != 0x502) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a8,"Invalid error code generated by ",0x20);
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  ((string *)local_338,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a8,(char *)local_338,(long)local_330);
        if (local_338 != (undefined1  [8])local_328) {
          operator_delete((void *)local_338,local_328[0]._M_allocated_capacity + 1);
        }
        local_338 = (undefined1  [8])
                    ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.super_TestCase.
                     super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  (&local_358,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_330,local_358._M_dataplus._M_p,local_358._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_330," returned error code [",0x16);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_330);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_330,"] instead of GL_INVALID_OPERATION.",0x22);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330);
        std::ios_base::~ios_base(local_2c0);
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        tcu::TestError::TestError
                  (pTVar5,(char *)local_338,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                   ,0xd36);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar4 + 0x5a8))
                (4,0,2,3,0x1405,
                 (this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset,0);
      iVar1 = (**(code **)(lVar4 + 0x800))();
      if (iVar1 != 0x502) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a8,"Invalid error code generated by ",0x20);
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  ((string *)local_338,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a8,(char *)local_338,(long)local_330);
        if (local_338 != (undefined1  [8])local_328) {
          operator_delete((void *)local_338,local_328[0]._M_allocated_capacity + 1);
        }
        local_338 = (undefined1  [8])
                    ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.super_TestCase.
                     super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  (&local_358,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_330,local_358._M_dataplus._M_p,local_358._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_330," returned error code [",0x16);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_330);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_330,"] instead of GL_INVALID_OPERATION.",0x22);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330);
        std::ios_base::~ios_base(local_2c0);
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        tcu::TestError::TestError
                  (pTVar5,(char *)local_338,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                   ,0xd49);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar4 + 0x1670))(0x8892);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glUnmapBuffer() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                      ,0xd4e);
    }
    uVar6 = uVar6 + 1;
    if (uVar6 == 4) {
      tcu::TestContext::setTestResult
                ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult DrawElementsBaseVertexNegativeMappedBufferObjectsTest::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* The test needs to be run in four iterations, where for each iteration we configure the VAO
	 * in a slightly different manner.
	 */
	for (int iteration = 0; iteration < 4; ++iteration)
	{
		bool use_clientside_index_data  = ((iteration & (1 << 0)) != 0);
		bool use_clientside_vertex_data = ((iteration & (1 << 1)) != 0);

		/* OpenGL does not support client-side data. */
		if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
		{
			if (use_clientside_index_data || use_clientside_vertex_data)
			{
				continue;
			}
		}

		/* Skip the iteration where no array buffer is used */
		if (use_clientside_vertex_data)
		{
			continue;
		}

		/* Set up the work environment */
		setUpNegativeTestObjects(use_clientside_vertex_data, use_clientside_index_data);

		/* Map the buffer object into process space */
		const glw::GLvoid* bo_ptr = gl.mapBufferRange(GL_ARRAY_BUFFER, 0, /* offset */
													  m_bo_negative_data_vertex_size, GL_MAP_READ_BIT);
		(void)bo_ptr;
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

		/* Perform draw calls that would otherwise have been valid, if it
		 * were not for the mapped VBO
		 */
		glw::GLenum error_code = GL_NONE;

		gl.drawElementsBaseVertex(GL_TRIANGLES, 3,								 /* count */
								  GL_UNSIGNED_INT, m_draw_call_index_offset, 0); /* basevertex */

		error_code = gl.getError();
		if (error_code != GL_INVALID_OPERATION)
		{
			std::stringstream error_sstream;

			error_sstream << "Invalid error code generated by "
						  << getFunctionName(FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX);

			m_testCtx.getLog() << tcu::TestLog::Message << getFunctionName(FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX)
							   << " returned error code [" << error_code << "] instead of GL_INVALID_OPERATION."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL(error_sstream.str().c_str());
		} /* if (error_code != GL_INVALID_OPERATION) */

		gl.drawElementsInstancedBaseVertex(GL_TRIANGLES, 3,								 /* count */
										   GL_UNSIGNED_INT, m_draw_call_index_offset, 1, /* instancecount */
										   0);											 /* basevertex */

		error_code = gl.getError();
		if (error_code != GL_INVALID_OPERATION)
		{
			std::stringstream error_sstream;

			error_sstream << "Invalid error code generated by "
						  << getFunctionName(FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX);

			m_testCtx.getLog() << tcu::TestLog::Message
							   << getFunctionName(FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX)
							   << " returned error code [" << error_code << "] instead of GL_INVALID_OPERATION."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL(error_sstream.str().c_str());
		}

		gl.drawRangeElementsBaseVertex(GL_TRIANGLES, 0, 2,							  /* end */
									   3,											  /* count */
									   GL_UNSIGNED_INT, m_draw_call_index_offset, 0); /* basevertex */

		error_code = gl.getError();
		if (error_code != GL_INVALID_OPERATION)
		{
			std::stringstream error_sstream;

			error_sstream << "Invalid error code generated by "
						  << getFunctionName(FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX);

			m_testCtx.getLog() << tcu::TestLog::Message << getFunctionName(FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX)
							   << " returned error code [" << error_code << "] instead of GL_INVALID_OPERATION."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL(error_sstream.str().c_str());
		}

		/* Unmap the BO before we proceed */
		gl.unmapBuffer(GL_ARRAY_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed");

	} /* for (all test iterations) */

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}